

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

EncConfig * __thiscall QPDFJob::EncConfig::modify(EncConfig *this,string *parameter)

{
  element_type *peVar1;
  int iVar2;
  string local_38;
  
  if (((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->keylen == 0x28) {
    iVar2 = std::__cxx11::string::compare((char *)parameter);
    ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    r2_modify = iVar2 == 0;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)parameter);
    if (iVar2 == 0) {
      peVar1 = (this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      peVar1->r3_assemble = true;
      peVar1->r3_annotate_and_form = true;
      peVar1->r3_form_filling = true;
      peVar1->r3_modify_other = true;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)parameter);
      if (iVar2 == 0) {
        peVar1 = (this->config->o->m).
                 super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar1->r3_assemble = true;
        peVar1->r3_annotate_and_form = true;
        peVar1->r3_form_filling = true;
        peVar1->r3_modify_other = false;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)parameter);
        if (iVar2 == 0) {
          peVar1 = (this->config->o->m).
                   super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar1->r3_assemble = true;
          peVar1->r3_annotate_and_form = false;
          peVar1->r3_form_filling = true;
          peVar1->r3_modify_other = false;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)parameter);
          if (iVar2 == 0) {
            peVar1 = (this->config->o->m).
                     super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            peVar1->r3_assemble = true;
            peVar1->r3_annotate_and_form = false;
            peVar1->r3_form_filling = false;
            peVar1->r3_modify_other = false;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)parameter);
            if (iVar2 == 0) {
              peVar1 = (this->config->o->m).
                       super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              peVar1->r3_assemble = false;
              peVar1->r3_annotate_and_form = false;
              peVar1->r3_form_filling = false;
              peVar1->r3_modify_other = false;
            }
            else {
              local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_38,"invalid modify option","");
              usage(&local_38);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_38._M_dataplus._M_p != &local_38.field_2) {
                operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::EncConfig*
QPDFJob::EncConfig::modify(std::string const& parameter)
{
    if (config->o.m->keylen == 40) {
        config->o.m->r2_modify = (parameter == "y");
    } else if (parameter == "all") {
        config->o.m->r3_assemble = true;
        config->o.m->r3_annotate_and_form = true;
        config->o.m->r3_form_filling = true;
        config->o.m->r3_modify_other = true;
    } else if (parameter == "annotate") {
        config->o.m->r3_assemble = true;
        config->o.m->r3_annotate_and_form = true;
        config->o.m->r3_form_filling = true;
        config->o.m->r3_modify_other = false;
    } else if (parameter == "form") {
        config->o.m->r3_assemble = true;
        config->o.m->r3_annotate_and_form = false;
        config->o.m->r3_form_filling = true;
        config->o.m->r3_modify_other = false;
    } else if (parameter == "assembly") {
        config->o.m->r3_assemble = true;
        config->o.m->r3_annotate_and_form = false;
        config->o.m->r3_form_filling = false;
        config->o.m->r3_modify_other = false;
    } else if (parameter == "none") {
        config->o.m->r3_assemble = false;
        config->o.m->r3_annotate_and_form = false;
        config->o.m->r3_form_filling = false;
        config->o.m->r3_modify_other = false;
    } else {
        usage("invalid modify option");
    }
    return this;
}